

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTreeEdge.cpp
# Opt level: O3

string * __thiscall
PhyloTreeEdge::toString_abi_cxx11_(string *__return_storage_ptr__,PhyloTreeEdge *this)

{
  ostream *poVar1;
  string s;
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  local_1b0._M_string_length = 0;
  local_1b0.field_2._M_local_buf[0] = '\0';
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  boost::to_string_helper<unsigned_long,std::allocator<unsigned_long>,std::__cxx11::string>
            (&(this->super_Bipartition).partition,&local_1b0,false);
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[",1);
  poVar1 = std::ostream::_M_insert<double>(this->length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string PhyloTreeEdge::toString() {
    string s;
    boost::to_string(partition, s);
    ostringstream ss;
    ss << "[" << length << "] " << s;
    return ss.str();
}